

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O1

aom_codec_err_t ctrl_set_svc_params(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  AV1_PRIMARY *pAVar5;
  AV1_COMP *cpi;
  uint *puVar6;
  LAYER_CONTEXT *pLVar7;
  undefined1 auVar8 [16];
  bool bVar9;
  _Bool _Var10;
  aom_codec_err_t aVar11;
  undefined8 *puVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  int64_t iVar16;
  int iVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar23;
  int iVar24;
  ulong uVar25;
  
  pAVar5 = ctx->ppi;
  cpi = pAVar5->cpi;
  uVar15 = args->gp_offset;
  if ((ulong)uVar15 < 0x29) {
    puVar12 = (undefined8 *)((ulong)uVar15 + (long)args->reg_save_area);
    args->gp_offset = uVar15 + 8;
  }
  else {
    puVar12 = (undefined8 *)args->overflow_arg_area;
    args->overflow_arg_area = puVar12 + 1;
  }
  puVar6 = (uint *)*puVar12;
  uVar15 = *puVar6;
  pAVar5->number_spatial_layers = uVar15;
  uVar3 = puVar6[1];
  pAVar5->number_temporal_layers = uVar3;
  (cpi->svc).number_spatial_layers = uVar15;
  (cpi->svc).number_temporal_layers = uVar3;
  uVar19 = (cpi->svc).prev_number_temporal_layers;
  if (((uVar19 != 0) && (uVar4 = (cpi->svc).prev_number_spatial_layers, uVar4 != 0)) &&
     ((uVar3 != uVar19 || (uVar15 != uVar4)))) {
    (pAVar5->seq_params).operating_points_cnt_minus_1 = uVar3 * uVar15 + -1;
    *(byte *)&ctx->next_frame_flags = (byte)ctx->next_frame_flags | 1;
    av1_set_svc_seq_params(pAVar5);
    uVar25._0_4_ = (cpi->svc).spatial_layer_id;
    uVar25._4_4_ = (cpi->svc).temporal_layer_id;
    uVar1 = (cpi->svc).number_spatial_layers;
    uVar2 = (cpi->svc).number_temporal_layers;
    iVar23 = uVar1 + -1;
    iVar24 = uVar2 + -1;
    auVar22._0_8_ =
         CONCAT44(-(uint)((int)uVar25._4_4_ < iVar24),-(uint)((int)(undefined4)uVar25 < iVar23));
    auVar22._8_8_ = 0;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar25 & auVar22._0_8_;
    auVar8._4_4_ = iVar24;
    auVar8._0_4_ = iVar23;
    auVar8._8_4_ = 0xffffffff;
    auVar8._12_4_ = 0xffffffff;
    auVar21 = ~auVar22 & auVar8 | auVar21;
    uVar25 = CONCAT44(-(uint)(0 < auVar21._4_4_),-(uint)(0 < auVar21._0_4_)) & auVar21._0_8_;
    (cpi->svc).spatial_layer_id = (int)uVar25;
    (cpi->svc).temporal_layer_id = (int)(uVar25 >> 0x20);
    iVar17 = (cpi->common).temporal_layer_id;
    iVar20 = (cpi->common).spatial_layer_id;
    if (iVar20 < iVar23) {
      iVar23 = iVar20;
    }
    if (iVar23 < 1) {
      iVar23 = 0;
    }
    (cpi->common).spatial_layer_id = iVar23;
    if (iVar17 < iVar24) {
      iVar24 = iVar17;
    }
    if (iVar24 < 1) {
      iVar24 = 0;
    }
    (cpi->common).temporal_layer_id = iVar24;
  }
  uVar15 = pAVar5->number_spatial_layers;
  if ((uVar15 < 2) && (pAVar5->number_temporal_layers < 2)) {
    if (pAVar5->seq_params_locked == 0) {
      aVar11 = update_encoder_cfg(ctx);
      return aVar11;
    }
    goto LAB_0019078f;
  }
  ctx->ppi->use_svc = 1;
  uVar15 = uVar15 * pAVar5->number_temporal_layers;
  if (0 < (int)uVar15) {
    uVar25 = 0;
    aVar11 = AOM_CODEC_INVALID_PARAM;
    bVar9 = false;
    do {
      if (0x3f < (int)puVar6[uVar25 + 2]) goto LAB_00190787;
      if (((int)puVar6[uVar25 + 0x22] < 0) || ((int)puVar6[uVar25 + 2] < (int)puVar6[uVar25 + 0x22])
         ) goto LAB_0019078a;
      uVar25 = uVar25 + 1;
    } while (uVar15 != uVar25);
  }
  _Var10 = av1_alloc_layer_context(cpi,uVar15);
  if (_Var10) {
    uVar15 = pAVar5->number_spatial_layers;
    if ((ulong)uVar15 == 0) {
      iVar16 = 0;
    }
    else {
      uVar3 = pAVar5->number_temporal_layers;
      iVar17 = 0;
      uVar25 = 0;
      iVar16 = 0;
      do {
        if (uVar3 != 0) {
          pLVar7 = (cpi->svc).layer_context;
          lVar18 = 0;
          do {
            lVar14 = (long)(iVar17 + (int)lVar18);
            pLVar7[lVar14].max_q = puVar6[lVar14 + 2];
            pLVar7[lVar14].min_q = puVar6[lVar14 + 0x22];
            uVar19 = puVar6[uVar25 + 0x42];
            if ((int)uVar19 < 2) {
              uVar19 = 1;
            }
            pLVar7[lVar14].scaling_factor_num = uVar19;
            uVar19 = puVar6[uVar25 + 0x46];
            if ((int)puVar6[uVar25 + 0x46] < 2) {
              uVar19 = 1;
            }
            pLVar7[lVar14].scaling_factor_den = uVar19;
            iVar20 = puVar6[lVar14 + 0x4a] * 1000;
            if (0x20c49b < (int)puVar6[lVar14 + 0x4a]) {
              iVar20 = 0x7fffffff;
            }
            pLVar7[lVar14].layer_target_bitrate = (long)iVar20;
            pLVar7[lVar14].framerate_factor = puVar6[lVar18 + 0x6a];
            if ((int)lVar18 - uVar3 == -1) {
              iVar16 = iVar16 + pLVar7[lVar14].layer_target_bitrate;
            }
            lVar18 = lVar18 + 1;
          } while ((uint)lVar18 != uVar3);
        }
        uVar25 = uVar25 + 1;
        iVar17 = iVar17 + uVar3;
      } while (uVar25 != uVar15);
    }
    iVar17 = pAVar5->seq_params_locked;
    (cpi->oxcf).rc_cfg.target_bandwidth = iVar16;
    (ctx->oxcf).rc_cfg.target_bandwidth = iVar16;
    if (iVar17 == 0) {
      (pAVar5->seq_params).operating_points_cnt_minus_1 =
           uVar15 * pAVar5->number_temporal_layers + -1;
      av1_init_layer_context(cpi);
      aVar11 = update_encoder_cfg(ctx);
      goto LAB_00190787;
    }
    lVar18 = (cpi->oxcf).rc_cfg.target_bandwidth;
    lVar14 = (cpi->oxcf).rc_cfg.optimal_buffer_level_ms;
    lVar13 = (cpi->oxcf).rc_cfg.maximum_buffer_size_ms;
    (pAVar5->p_rc).starting_buffer_level =
         ((cpi->oxcf).rc_cfg.starting_buffer_level_ms * lVar18) / 1000;
    if (lVar14 == 0) {
      lVar14 = lVar18 + 7;
      if (-1 < lVar18) {
        lVar14 = lVar18;
      }
      lVar14 = lVar14 >> 3;
    }
    else {
      lVar14 = (lVar14 * lVar18) / 1000;
    }
    (pAVar5->p_rc).optimal_buffer_level = lVar14;
    if (lVar13 == 0) {
      lVar14 = lVar18 + 7;
      if (-1 < lVar18) {
        lVar14 = lVar18;
      }
      lVar14 = lVar14 >> 3;
    }
    else {
      lVar14 = (lVar13 * lVar18) / 1000;
    }
    (pAVar5->p_rc).maximum_buffer_size = lVar14;
    lVar18 = (pAVar5->p_rc).buffer_level;
    lVar13 = (pAVar5->p_rc).bits_off_target;
    if (lVar14 <= lVar13) {
      lVar13 = lVar14;
    }
    (pAVar5->p_rc).bits_off_target = lVar13;
    if (lVar18 < lVar14) {
      lVar14 = lVar18;
    }
    (pAVar5->p_rc).buffer_level = lVar14;
    av1_update_layer_context_change_config(cpi,iVar16);
    aVar11 = AOM_CODEC_INVALID_PARAM;
    bVar9 = true;
    if ((uint)(cpi->svc).number_spatial_layers < (cpi->common).current_frame.frame_number) {
      pAVar5 = cpi->ppi;
      if (pAVar5->use_svc == 0) {
        iVar17 = (cpi->rc).avg_frame_bandwidth;
        iVar20 = (cpi->rc).prev_avg_frame_bandwidth >> 1;
        if (iVar20 < iVar17 / 3 || iVar17 < iVar20) {
          (cpi->rc).rc_1_frame = 0;
          (cpi->rc).rc_2_frame = 0;
          iVar16 = (pAVar5->p_rc).optimal_buffer_level;
          (pAVar5->p_rc).bits_off_target = iVar16;
          (pAVar5->p_rc).buffer_level = iVar16;
        }
      }
      else {
        av1_svc_check_reset_layer_rc_flag(cpi);
      }
    }
  }
  else {
    aVar11 = AOM_CODEC_MEM_ERROR;
LAB_00190787:
    bVar9 = false;
  }
LAB_0019078a:
  if (!bVar9) {
    return aVar11;
  }
LAB_0019078f:
  av1_check_fpmt_config(ctx->ppi,&ctx->ppi->cpi->oxcf);
  return AOM_CODEC_OK;
}

Assistant:

static aom_codec_err_t ctrl_set_svc_params(aom_codec_alg_priv_t *ctx,
                                           va_list args) {
  AV1_PRIMARY *const ppi = ctx->ppi;
  AV1_COMP *const cpi = ppi->cpi;
  aom_svc_params_t *const params = va_arg(args, aom_svc_params_t *);
  int64_t target_bandwidth = 0;
  ppi->number_spatial_layers = params->number_spatial_layers;
  ppi->number_temporal_layers = params->number_temporal_layers;
  cpi->svc.number_spatial_layers = params->number_spatial_layers;
  cpi->svc.number_temporal_layers = params->number_temporal_layers;
  // Sequence parameters (operating_points_cnt_minus_1, operating_point_idc[])
  // need to be updated if the number of layers have changed.
  // Force a keyframe here and update the two relevant sequence parameters.
  if (cpi->svc.prev_number_temporal_layers &&
      cpi->svc.prev_number_spatial_layers &&
      (cpi->svc.number_temporal_layers !=
           cpi->svc.prev_number_temporal_layers ||
       cpi->svc.number_spatial_layers != cpi->svc.prev_number_spatial_layers)) {
    SequenceHeader *const seq_params = &ppi->seq_params;
    seq_params->operating_points_cnt_minus_1 =
        ppi->number_spatial_layers * ppi->number_temporal_layers - 1;
    ctx->next_frame_flags |= AOM_EFLAG_FORCE_KF;
    av1_set_svc_seq_params(ppi);
    // Check for valid values for the spatial/temporal_layer_id here, since
    // there has been a dynamic change in the number_spatial/temporal_layers,
    // and if the ctrl_set_layer_id is not used after this call, the
    // previous (last_encoded) values of spatial/temporal_layer_id will be used,
    // which may be invalid.
    cpi->svc.spatial_layer_id = AOMMAX(
        0,
        AOMMIN(cpi->svc.spatial_layer_id, cpi->svc.number_spatial_layers - 1));
    cpi->svc.temporal_layer_id =
        AOMMAX(0, AOMMIN(cpi->svc.temporal_layer_id,
                         cpi->svc.number_temporal_layers - 1));
    cpi->common.spatial_layer_id =
        AOMMAX(0, AOMMIN(cpi->common.spatial_layer_id,
                         cpi->svc.number_spatial_layers - 1));
    cpi->common.temporal_layer_id =
        AOMMAX(0, AOMMIN(cpi->common.temporal_layer_id,
                         cpi->svc.number_temporal_layers - 1));
  }

  if (ppi->number_spatial_layers > 1 || ppi->number_temporal_layers > 1) {
    unsigned int sl, tl;
    ctx->ppi->use_svc = 1;
    const int num_layers =
        ppi->number_spatial_layers * ppi->number_temporal_layers;
    for (int layer = 0; layer < num_layers; ++layer) {
      if (params->max_quantizers[layer] > 63 ||
          params->min_quantizers[layer] < 0 ||
          params->min_quantizers[layer] > params->max_quantizers[layer]) {
        return AOM_CODEC_INVALID_PARAM;
      }
    }
    if (!av1_alloc_layer_context(cpi, num_layers)) return AOM_CODEC_MEM_ERROR;

    for (sl = 0; sl < ppi->number_spatial_layers; ++sl) {
      for (tl = 0; tl < ppi->number_temporal_layers; ++tl) {
        const int layer = LAYER_IDS_TO_IDX(sl, tl, ppi->number_temporal_layers);
        LAYER_CONTEXT *lc = &cpi->svc.layer_context[layer];
        lc->max_q = params->max_quantizers[layer];
        lc->min_q = params->min_quantizers[layer];
        lc->scaling_factor_num = AOMMAX(1, params->scaling_factor_num[sl]);
        lc->scaling_factor_den = AOMMAX(1, params->scaling_factor_den[sl]);
        const int layer_target_bitrate = params->layer_target_bitrate[layer];
        if (layer_target_bitrate > INT_MAX / 1000) {
          lc->layer_target_bitrate = INT_MAX;
        } else {
          lc->layer_target_bitrate = 1000 * layer_target_bitrate;
        }
        lc->framerate_factor = params->framerate_factor[tl];
        if (tl == ppi->number_temporal_layers - 1)
          target_bandwidth += lc->layer_target_bitrate;
      }
    }

    if (ppi->seq_params_locked) {
      AV1EncoderConfig *const oxcf = &cpi->oxcf;
      // Keep ctx->oxcf in sync in case further codec controls are made prior
      // to encoding.
      ctx->oxcf.rc_cfg.target_bandwidth = oxcf->rc_cfg.target_bandwidth =
          target_bandwidth;
      set_primary_rc_buffer_sizes(oxcf, ppi);
      av1_update_layer_context_change_config(cpi, target_bandwidth);
      check_reset_rc_flag(cpi);
    } else {
      // Note av1_init_layer_context() relies on cpi->oxcf. The order of that
      // call and the ones in the other half of this block (which
      // update_encoder_cfg() transitively makes) is important. So we keep
      // ctx->oxcf and cpi->oxcf in sync here as update_encoder_cfg() will
      // overwrite cpi->oxcf with ctx->oxcf.
      ctx->oxcf.rc_cfg.target_bandwidth = cpi->oxcf.rc_cfg.target_bandwidth =
          target_bandwidth;
      SequenceHeader *const seq_params = &ppi->seq_params;
      seq_params->operating_points_cnt_minus_1 =
          ppi->number_spatial_layers * ppi->number_temporal_layers - 1;

      av1_init_layer_context(cpi);
      // update_encoder_cfg() is somewhat costly and this control may be called
      // multiple times, so update_encoder_cfg() is only called to ensure frame
      // and superblock sizes are updated before they're fixed by the first
      // encode call.
      return update_encoder_cfg(ctx);
    }
  } else if (!ppi->seq_params_locked) {
    // Ensure frame and superblock sizes are updated.
    return update_encoder_cfg(ctx);
  }
  av1_check_fpmt_config(ctx->ppi, &ctx->ppi->cpi->oxcf);
  return AOM_CODEC_OK;
}